

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::read_int_array(Simulator *this,PCode *code)

{
  value_type vVar1;
  int iVar2;
  string *psVar3;
  vector<int,_std::allocator<int>_> *__x;
  reference pvVar4;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> array;
  Symbol *symbol;
  PCode *pPStack_18;
  int input;
  PCode *code_local;
  Simulator *this_local;
  
  symbol._4_4_ = 0;
  pPStack_18 = code;
  code_local = (PCode *)this;
  psVar3 = PCode::first_abi_cxx11_(code);
  array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)ScopeTree::resolve(&this->tree_,psVar3);
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&symbol + 4));
  __x = Symbol::int_array((Symbol *)
                          array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40,__x);
  vVar1 = symbol._4_4_;
  psVar3 = PCode::second_abi_cxx11_(pPStack_18);
  iVar2 = get_second_parameter(this,psVar3);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)iVar2);
  *pvVar4 = vVar1;
  Symbol::set_value((Symbol *)
                    array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (vector<int,_std::allocator<int>_> *)local_40);
  Symbol::set_assigned
            ((Symbol *)
             array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  inc_eip(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void Simulator::read_int_array(const PCode &code) {
    int input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<int> array = symbol.int_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}